

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

PathPtr __thiscall kj::PathPtr::parent(PathPtr *this)

{
  PathPtr PVar1;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  
  _kjCondition.left = (this->parts).size_;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = _kjCondition.left != 0;
  if (_kjCondition.result) {
    PVar1.parts.size_ = _kjCondition.left - 1;
    PVar1.parts.ptr = (this->parts).ptr;
    return (PathPtr)PVar1.parts;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[24]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x7f,FAILED,"parts.size() > 0","_kjCondition,\"root path has no parent\"",
             &_kjCondition,(char (*) [24])"root path has no parent");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

const InMemoryFileFactory& memfdInMemoryFileFactory() {
  class FactoryImpl: public InMemoryFileFactory {
  public:
    kj::Own<const File> create(const Clock& clock) const override {
      return newMemfdFile(0);
    }
  };
  static const FactoryImpl instance;
  return instance;
}